

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O0

int push0_pipe_start(void *arg)

{
  uint16_t uVar1;
  push0_pipe *p;
  void *arg_local;
  
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x51) {
    nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x20));
    push0_pipe_ready((push0_pipe *)arg);
    arg_local._4_4_ = 0;
  }
  else {
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,0x51
                );
    arg_local._4_4_ = 0xd;
  }
  return arg_local._4_4_;
}

Assistant:

static int
push0_pipe_start(void *arg)
{
	push0_pipe *p = arg;

	if (nni_pipe_peer(p->pipe) != NNI_PROTO_PULL_V0) {
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), NNI_PROTO_PULL_V0);
		return (NNG_EPROTO);
	}

	// Schedule a receiver.  This is mostly so that we can detect
	// a closed transport pipe.
	nni_pipe_recv(p->pipe, &p->aio_recv);
	push0_pipe_ready(p);

	return (0);
}